

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O0

void __thiscall
Centaurus::Grammar<wchar_t>::print(Grammar<wchar_t> *this,wostream *os,Identifier *key,int maxdepth)

{
  wostream *pwVar1;
  undefined1 local_58 [8];
  ATNPrinter<wchar_t> printer;
  int maxdepth_local;
  Identifier *key_local;
  wostream *os_local;
  Grammar<wchar_t> *this_local;
  
  printer.m_maxdepth = maxdepth;
  pwVar1 = std::operator<<(os,L"digraph ");
  pwVar1 = Centaurus::operator<<(pwVar1,key);
  pwVar1 = std::operator<<(pwVar1,L" {");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar1 = std::operator<<(os,L"rankdir=\"LR\";");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar1 = std::operator<<(os,L"graph [ charset=\"UTF-8\" ];");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar1 = std::operator<<(os,L"node [ style=\"solid,filled\" ];");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar1 = std::operator<<(os,L"edge [ style=\"solid\" ];");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  ATNPrinter<wchar_t>::ATNPrinter
            ((ATNPrinter<wchar_t> *)local_58,&this->m_networks,printer.m_maxdepth);
  ATNPrinter<wchar_t>::print((ATNPrinter<wchar_t> *)local_58,os,key);
  pwVar1 = std::operator<<(os,L"}");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  ATNPrinter<wchar_t>::~ATNPrinter((ATNPrinter<wchar_t> *)local_58);
  return;
}

Assistant:

void print(std::wostream& os, const Identifier& key, int maxdepth = 3) const
	{
		os << L"digraph " << key << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

		ATNPrinter<TCHAR> printer(m_networks, maxdepth);

		printer.print(os, key);

		os << L"}" << std::endl;
	}